

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O2

void mbedtls_ct_zeroize_if(mbedtls_ct_condition_t condition,void *buf,size_t len)

{
  ulong uVar1;
  
  uVar1 = 0;
  while (uVar1 + 4 <= len) {
    *(uint *)((long)buf + uVar1) = *(uint *)((long)buf + uVar1) & ~(uint)condition;
    uVar1 = uVar1 + 4;
  }
  for (; uVar1 < len; uVar1 = uVar1 + 1) {
    *(byte *)((long)buf + uVar1) = *(byte *)((long)buf + uVar1) & (byte)~(uint)condition;
  }
  return;
}

Assistant:

void mbedtls_ct_zeroize_if(mbedtls_ct_condition_t condition, void *buf, size_t len)
{
    uint32_t mask = (uint32_t) ~condition;
    uint8_t *p = (uint8_t *) buf;
    size_t i = 0;
#if defined(MBEDTLS_EFFICIENT_UNALIGNED_ACCESS)
    for (; (i + 4) <= len; i += 4) {
        mbedtls_put_unaligned_uint32((void *) (p + i),
                                     mbedtls_get_unaligned_uint32((void *) (p + i)) & mask);
    }
#endif
    for (; i < len; i++) {
        p[i] = p[i] & mask;
    }
}